

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O2

cupdlp_retcode
cupdlp_pc_scaling(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
                 cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  double __y;
  int len;
  uint len_00;
  cupdlp_float *col_scaling;
  cupdlp_float *row_scaling;
  cupdlp_int *pcVar1;
  ulong uVar2;
  long lVar3;
  int i;
  cupdlp_retcode cVar4;
  ulong uVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  __y = scaling->PcAlpha;
  col_scaling = (cupdlp_float *)calloc((long)(int)len_00,8);
  cVar4 = 1;
  if (col_scaling != (cupdlp_float *)0x0) {
    row_scaling = (cupdlp_float *)calloc((long)len,8);
    if (row_scaling != (cupdlp_float *)0x0) {
      if ((2.0 < __y) || (__y < 0.0)) {
        puts("alpha should be in [0, 2]");
        exit(1);
      }
      if (0 < len) {
        uVar2 = 0;
        if (0 < (int)len_00) {
          uVar2 = (ulong)len_00;
        }
        uVar5 = 0;
        while (uVar5 != uVar2) {
          pcVar1 = csc->colMatBeg;
          for (lVar3 = (long)pcVar1[uVar5]; lVar3 < pcVar1[uVar5 + 1]; lVar3 = lVar3 + 1) {
            dVar7 = csc->colMatElem[lVar3];
            dVar8 = -dVar7;
            if (-dVar7 <= dVar7) {
              dVar8 = dVar7;
            }
            dVar7 = pow(dVar8,__y);
            col_scaling[uVar5] = dVar7 + col_scaling[uVar5];
            pcVar1 = csc->colMatBeg;
          }
          dVar7 = pow(col_scaling[uVar5],1.0 / __y);
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          col_scaling[uVar5] =
               (cupdlp_float)
               (~-(ulong)(dVar7 == 0.0) & (ulong)dVar7 | -(ulong)(dVar7 == 0.0) & 0x3ff0000000000000
               );
          uVar5 = uVar5 + 1;
        }
        for (lVar3 = 0; lVar3 < csc->colMatBeg[(int)len_00]; lVar3 = lVar3 + 1) {
          dVar7 = csc->colMatElem[lVar3];
          dVar8 = -dVar7;
          if (-dVar7 <= dVar7) {
            dVar8 = dVar7;
          }
          dVar7 = pow(dVar8,2.0 - __y);
          row_scaling[csc->colMatIdx[lVar3]] = dVar7 + row_scaling[csc->colMatIdx[lVar3]];
        }
        for (sVar6 = 0; (long)len != sVar6; sVar6 = sVar6 + 1) {
          dVar7 = pow(row_scaling[sVar6],1.0 / (2.0 - __y));
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          row_scaling[sVar6] =
               (cupdlp_float)
               (~-(ulong)(dVar7 == 0.0) & (ulong)dVar7 | -(ulong)(dVar7 == 0.0) & 0x3ff0000000000000
               );
        }
      }
      scale_problem(csc,cost,lower,upper,rhs,col_scaling,row_scaling);
      cupdlp_cdot(scaling->colScale,col_scaling,len_00);
      cupdlp_cdot(scaling->rowScale,row_scaling,len);
      cVar4 = 0;
      goto LAB_0036a61d;
    }
  }
  row_scaling = (cupdlp_float *)0x0;
LAB_0036a61d:
  free(col_scaling);
  free(row_scaling);
  return cVar4;
}

Assistant:

cupdlp_retcode cupdlp_pc_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                 cupdlp_float *lower, cupdlp_float *upper,
                                 cupdlp_float *rhs, CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_pc_scaling(CUPDLPwork *work, cupdlp_float alpha)
{
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;
  cupdlp_float alpha = scaling->PcAlpha;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  if (alpha > 2.0 || alpha < 0.0) {
    cupdlp_printf("alpha should be in [0, 2]\n");
    exit(1);
  }

  if (nRows > 0) {
    for (int i = 0; i < nCols; i++) {
      for (int j = csc->colMatBeg[i]; j < csc->colMatBeg[i + 1]; j++) {
        current_col_scaling[i] += POWF(ABS(csc->colMatElem[j]), alpha);
      }
      current_col_scaling[i] = SQRTF(POWF(current_col_scaling[i], 1.0 / alpha));
      if (current_col_scaling[i] == 0.0) {
        current_col_scaling[i] = 1.0;
      }
    }

    for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
      current_row_scaling[csc->colMatIdx[i]] +=
          POWF(ABS(csc->colMatElem[i]), 2.0 - alpha);
    }
    for (int i = 0; i < nRows; i++) {
      current_row_scaling[i] =
          SQRTF(POWF(current_row_scaling[i], 1.0 / (2.0 - alpha)));
      if (current_row_scaling[i] == 0.0) {
        current_row_scaling[i] = 1.0;
      }
    }
  }

  // apply scaling
  // scale_problem(work, current_col_scaling, current_row_scaling);
  scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                current_row_scaling);

  // update scaling
  cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
  cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);

exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}